

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall
Js::ScriptContext::MakeUtf8SourceInfo
          (ScriptContext *this,byte *script,size_t cb,SRCINFO *pSrcInfo,
          Utf8SourceInfo **ppSourceInfo,LoadScriptFlag loadScriptFlag,Var scriptSource)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  Recycler *this_00;
  uchar *dest;
  size_t numBytes;
  Utf8SourceInfo *pUVar5;
  uint32 left;
  ulong uVar6;
  byte bVar7;
  undefined1 local_78 [8];
  TrackAllocData data;
  
  bVar7 = (byte)loadScriptFlag;
  data._32_8_ = ppSourceInfo;
  if ((loadScriptFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_None) {
    uVar6 = cb >> 1;
    bVar2 = IsValidCharCount(uVar6);
    if (!bVar2) {
      Throw::OutOfMemory();
    }
    if (0x7ffffffe < uVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x7a3,"(length < 0x7fffffff)","length < MAXLONG");
      if (!bVar2) goto LAB_006ee220;
      *puVar4 = 0;
    }
    left = (uint32)uVar6;
    uVar3 = UInt32Math::MulAdd<3u,1u>(left);
    uVar6 = (ulong)uVar3;
    local_78 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_2cb70d5;
    data.filename._0_4_ = 0x7ad;
    data.plusSize = uVar6;
    this_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_78);
    dest = Memory::AllocateArray<Memory::Recycler,unsigned_char,false>
                     ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeafTrace,0,uVar6);
    numBytes = utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)0>
                         (dest,uVar6,(char16 *)script,left);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_014565e0,ParsePhase);
    if ((bVar2) && (DAT_0145948a == '\x01')) {
      Output::Print(L"Loading script.\n  Unicode (in bytes)    %u\n  UTF-8 size (in bytes) %u\n  Expected savings      %d\n"
                    ,cb & 0xfffffffffffffffe,numBytes,(cb & 0xfffffffffffffffe) - numBytes);
    }
    if (uVar6 < numBytes + 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                  ,0x7bc,"(cbNeeded + 1 <= cbUtf8Buffer)",
                                  "cbNeeded + 1 <= cbUtf8Buffer");
      if (!bVar2) {
LAB_006ee220:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    pUVar5 = Utf8SourceInfo::New(this,dest,left,numBytes,pSrcInfo,(bool)(bVar7 >> 7));
  }
  else if ((loadScriptFlag >> 8 & 1) == 0) {
    pUVar5 = Utf8SourceInfo::New(this,script,(int32)cb,cb,pSrcInfo,(bool)(bVar7 >> 7));
  }
  else {
    pUVar5 = Utf8SourceInfo::NewWithNoCopy
                       (this,script,(int32)cb,cb,pSrcInfo,(bool)(bVar7 >> 7),scriptSource);
  }
  *(Utf8SourceInfo **)data._32_8_ = pUVar5;
  return;
}

Assistant:

void ScriptContext::MakeUtf8SourceInfo(const byte* script,
        size_t cb,
        SRCINFO const * pSrcInfo,
        Utf8SourceInfo** ppSourceInfo,
        LoadScriptFlag loadScriptFlag,
        Js::Var scriptSource)
    {
        LPUTF8 utf8Script = nullptr;
        size_t length = cb;
        size_t cbNeeded = 0;

        bool isLibraryCode = ((loadScriptFlag & LoadScriptFlag_LibraryCode) == LoadScriptFlag_LibraryCode);

        if ((loadScriptFlag & LoadScriptFlag_Utf8Source) != LoadScriptFlag_Utf8Source)
        {
            // Convert to UTF8 and then load that
            length = cb / sizeof(char16);
            if (!IsValidCharCount(length))
            {
                Js::Throw::OutOfMemory();
            }
            Assert(length < MAXLONG);
            charcount_t ccLength = static_cast<charcount_t>(length);

            // Allocate memory for the UTF8 output buffer.
            // We need at most 3 bytes for each Unicode code point.
            // The + 1 is to include the terminating NUL.
            // Nit:  Technically, we know that the NUL only needs 1 byte instead of
            // 3, but that's difficult to express in a SAL annotation for "EncodeInto".
            size_t cbUtf8Buffer = UInt32Math::MulAdd<3, 1>(ccLength);

            utf8Script = RecyclerNewArrayLeafTrace(this->GetRecycler(), utf8char_t, cbUtf8Buffer);

            cbNeeded = utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::Cesu8>(utf8Script, cbUtf8Buffer, (const char16*)script, ccLength);

#if DBG_DUMP && defined(PROFILE_MEM)
            if (Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::ParsePhase) && Configuration::Global.flags.Verbose)
            {
                Output::Print(_u("Loading script.\n")
                    _u("  Unicode (in bytes)    %u\n")
                    _u("  UTF-8 size (in bytes) %u\n")
                    _u("  Expected savings      %d\n"), length * sizeof(char16), cbNeeded, length * sizeof(char16) - cbNeeded);
            }
#endif

            // Free unused bytes
            Assert(cbNeeded + 1 <= cbUtf8Buffer);
            *ppSourceInfo = Utf8SourceInfo::New(this, utf8Script, (int)length,
                cbNeeded, pSrcInfo, isLibraryCode);
        }
        else
        {
            // We do not own the memory passed into DefaultLoadScriptUtf8. We need to save it so we copy the memory.
#ifndef NTBUILD
            if (loadScriptFlag & LoadScriptFlag_ExternalArrayBuffer)
            {
                *ppSourceInfo = Utf8SourceInfo::NewWithNoCopy(this,
                    script, (int)length, cb, pSrcInfo, isLibraryCode,
                    scriptSource);
            }
            else
#endif
            {
                // The 'length' here is not correct (we will get the length from the parser) however parser isn't done yet.
                // Once the parser is done we will update the utf8sourceinfo's length correctly
                *ppSourceInfo = Utf8SourceInfo::New(this, script,
                    (int)length, cb, pSrcInfo, isLibraryCode);
            }
        }
    }